

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

void Hex::Hexdumper<unsigned_char>::output_asc_padding(ostream *os,int n)

{
  allocator<char> local_39;
  string local_38 [8];
  string padding;
  int oneunit;
  int n_local;
  ostream *os_local;
  
  padding.field_2._8_4_ = 1;
  padding.field_2._12_4_ = n;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,(long)n,' ',&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::operator<<(os,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void output_asc_padding(std::ostream& os, int n)
    {
        int oneunit = sizeof(T);
        std::string padding(n*oneunit, ' ');
        os << padding;
    }